

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O3

void scan_bitstream_ace(TrackData *trackdata)

{
  bool bVar1;
  uint8_t uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  BitBuffer *this;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int i;
  int iVar10;
  uint uVar11;
  uint8_t data;
  Data block;
  Track track;
  Sector sector;
  byte local_d5;
  uint local_d4;
  TrackData *local_d0;
  Data local_c8;
  int local_a4;
  Header local_a0;
  Track local_90;
  Sector local_70;
  
  this = TrackData::bitstream(trackdata);
  iVar6 = 0;
  BitBuffer::seek(this,0);
  Track::Track(&local_90,0);
  local_90.tracklen = BitBuffer::track_bitsize(this);
  local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (uchar *)0x0;
  local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (uchar *)0x0;
  local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (uchar *)0x0;
  local_a4 = 0;
  uVar9 = 0;
LAB_0013d43f:
  uVar11 = 0;
LAB_0013d442:
  while( true ) {
    bVar1 = BitBuffer::wrapped(this);
    if (bVar1) {
      if (iVar6 != 2) goto LAB_0013d748;
      goto LAB_0013d69e;
    }
    uVar2 = BitBuffer::read1(this);
    bVar3 = BitBuffer::read1(this);
    if (((bVar3 | uVar2 * '\x02') & 2) != 0) break;
    BitBuffer::read1(this);
  }
  if ((bVar3 & 1) == 0) goto code_r0x0013d483;
  local_d5 = 0;
  uVar8 = 2;
  iVar10 = 0;
  uVar11 = 1;
  local_d4 = uVar9;
  local_d0 = trackdata;
  do {
    uVar7 = uVar11;
    bVar3 = BitBuffer::read1(this);
    bVar4 = BitBuffer::read1(this);
    trackdata = local_d0;
    uVar9 = local_d4;
    uVar5 = bVar4 & 1 ^ 1;
    uVar8 = uVar8 & ((uint)bVar3 * 2 | (uint)bVar4);
    local_d5 = (byte)(uVar5 << ((byte)iVar10 & 0x1f)) | local_d5;
    iVar10 = iVar10 + 1;
    uVar11 = uVar5 ^ uVar7;
  } while (iVar10 != 10);
  bVar1 = (bVar4 & 1) != 0;
  if ((bVar1 || uVar8 == 0) || uVar5 == uVar7) goto LAB_0013d53d;
  if (iVar6 == 1) {
    if (local_d5 == 0xff) {
LAB_0013d5e1:
      iVar6 = 1;
    }
    else {
      if (local_d5 != 0x2a) goto LAB_0013d5b2;
      iVar6 = BitBuffer::tell(this);
      local_a4 = BitBuffer::track_offset(this,iVar6);
      iVar6 = 2;
    }
  }
  else if (iVar6 == 0) {
    if (local_d5 == 0xff) goto LAB_0013d5e1;
LAB_0013d5b2:
    iVar6 = 0;
    if (local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      iVar6 = 0;
    }
  }
  goto LAB_0013d664;
code_r0x0013d483:
  bVar1 = 0x3f < uVar11;
  uVar11 = uVar11 + 1;
  if (bVar1 && iVar6 == 2) {
LAB_0013d69e:
    iVar6 = SizeToCode(0x1000);
    Header::Header(&local_a0,&trackdata->cylhead,0,iVar6);
    Sector::Sector(&local_70,_250K,Ace,&local_a0,0);
    local_70.offset = local_a4;
    bVar1 = IsValidDeepThoughtData(&local_c8);
    if (!bVar1) {
      local_a0._0_8_ = CH((trackdata->cylhead).cyl,(trackdata->cylhead).head);
      Message<char_const*>(msgWarning,"block checksum error on %s",(char **)&local_a0);
      uVar9 = 1;
    }
    Sector::add(&local_70,&local_c8,(bool)((byte)uVar9 & 1),'\0');
    Track::add(&local_90,&local_70);
    std::vector<Data,_std::allocator<Data>_>::~vector
              ((vector<Data,_std::allocator<Data>_> *)((long)&local_70 + 0x28));
LAB_0013d748:
    TrackData::add(trackdata,&local_90);
    if (local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_90.m_sectors);
    return;
  }
  goto LAB_0013d442;
LAB_0013d53d:
  if (iVar6 == 2) {
    iVar6 = 2;
    if (((local_d4 & 1) == 0) || (opt.verbose != 0)) {
      if (bVar1 || uVar8 == 0) {
        local_a0.cyl = (int)local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
        local_70.header._0_8_ = CH((local_d0->cylhead).cyl,(local_d0->cylhead).head);
        Message<int,char_const*>
                  (msgWarning,"framing error at offset %u on on %s",&local_a0.cyl,(char **)&local_70
                  );
      }
      else if (uVar5 == uVar7) {
        local_a0.cyl = (int)local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
        local_70.header._0_8_ = CH((local_d0->cylhead).cyl,(local_d0->cylhead).head);
        Message<int,char_const*>
                  (msgWarning,"parity error at offset %u on on %s",&local_a0.cyl,(char **)&local_70)
        ;
      }
      uVar9 = 1;
    }
LAB_0013d664:
    if (local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c8,
                 (iterator)
                 local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_d5);
    }
    else {
      *local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish = local_d5;
      local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_c8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  goto LAB_0013d43f;
}

Assistant:

void scan_bitstream_ace(TrackData& trackdata)
{
    auto& bitbuf = trackdata.bitstream();
    bitbuf.seek(0);

    Track track;
    track.tracklen = bitbuf.track_bitsize();

    uint32_t word = 0;

    enum State { stateWant255, stateWant42, stateData };
    State state = stateWant255;
    Data block;
    int idle = 0;
    bool dataerror = false;
    int bit;
    int data_offset = 0;

    while (!bitbuf.wrapped())
    {
        // Read the next clock and data bits
        word = (bitbuf.read1() << 1) | bitbuf.read1();

        // If the clock is missing, attempt to re-sync by skipping a bit
        if (!(word & 2))
        {
            bitbuf.read1();
            continue;
        }

        // Outside a frame a 1 represents the idle state
        if (~word & 1)
        {
            // Stop if we've found an idle patch after valid data
            if (++idle > 64 && state == stateData)
                break;

            // Ignore idle otherwise
            continue;
        }

        // The transition to 0 represents a potential start bit, so reset the idle count
        idle = 0;

        bit = 0;
        uint8_t data = 0;   // no data yet
        int parity = 1;     // odd parity
        int clock = 2;      // valid clock

        // Read 8 data bits, 1 parity bit, 1 stop bit
        for (int i = 0; i < 10; ++i)
        {
            // Fetch clock and data bits
            word = (bitbuf.read1() << 1) | bitbuf.read1();

            // Extract bit, update parity and clock status
            bit = ~word & 1;
            parity ^= bit;
            clock &= word;

            // Add data bit (lsb to msb order)
            data |= (bit << i) & 0xff;

        }

        // Check for errors
        if (!clock || !bit || !parity)
        {
            if (state != stateData)
                continue;

            // Report only first error during the data block, unless verbose
            if (!dataerror || opt.verbose)
            {
                dataerror = true;

                if (!clock || !bit)
                    Message(msgWarning, "framing error at offset %u on on %s", block.size(), CH(trackdata.cylhead.cyl, trackdata.cylhead.head));
                else if (!parity) // inverted due to inclusion of stop bit above
                    Message(msgWarning, "parity error at offset %u on on %s", block.size(), CH(trackdata.cylhead.cyl, trackdata.cylhead.head));
            }
        }
        else
        {
            switch (state)
            {
            case stateWant255:
                if (data == 255)
                    state = stateWant42;
                else
                    block.clear();
                break;

            case stateWant42:
                if (data == 42)
                {
                    state = stateData;
                    data_offset = bitbuf.track_offset(bitbuf.tell());
                }
                else if (data != 255)
                {
                    state = stateWant255;
                    block.clear();
                }
                break;

            default:
                break;
            }
        }

        // Save the byte
        block.push_back(data);
    }

    // If we found a block on the track, save it in a 4K sector with id=0.
    if (state == stateData)
    {
        Sector sector(DataRate::_250K, Encoding::Ace, Header(trackdata.cylhead, 0, SizeToCode(4096)));
        sector.offset = data_offset;

        // Skip header bytes
        if (!IsValidDeepThoughtData(block))
        {
            Message(msgWarning, "block checksum error on %s", CH(trackdata.cylhead.cyl, trackdata.cylhead.head));
            dataerror = true;
        }

        sector.add(std::move(block), dataerror, 0x00);
        track.add(std::move(sector));
    }

    trackdata.add(std::move(track));
}